

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O1

void check_call_loop_wrappage(Context *ctx,int regnum)

{
  bool bVar1;
  int iVar2;
  RegisterList *in_RDX;
  char *pcVar3;
  RegisterList *pRVar4;
  uint uVar5;
  
  iVar2 = (uint)(0 < ctx->loops) * 2 + -1;
  pRVar4 = (ctx->used_registers).next;
  do {
    if (pRVar4 == (RegisterList *)0x0) {
      in_RDX = (RegisterList *)0x0;
      break;
    }
    uVar5 = pRVar4->regtype << 0x10 | pRVar4->regnum;
    if ((regnum | 0x120000U) == uVar5) {
      bVar1 = false;
      in_RDX = pRVar4;
    }
    else if ((regnum | 0x120000U) < uVar5) {
      in_RDX = (RegisterList *)0x0;
      bVar1 = false;
    }
    else {
      pRVar4 = pRVar4->next;
      bVar1 = true;
    }
  } while (bVar1);
  if (in_RDX == (RegisterList *)0x0) {
    pcVar3 = "Invalid label for CALL";
LAB_0011dd96:
    failf(ctx,"%s",pcVar3);
    return;
  }
  if (in_RDX->misc == 0) {
    in_RDX->misc = iVar2;
  }
  else if (in_RDX->misc != iVar2) {
    if (ctx->loops < 1) {
      pcVar3 = "CALL to this label must not be wrapped in LOOP/ENDLOOP";
    }
    else {
      pcVar3 = "CALL to this label must be wrapped in LOOP/ENDLOOP";
    }
    goto LAB_0011dd96;
  }
  return;
}

Assistant:

static void check_call_loop_wrappage(Context *ctx, const int regnum)
{
    // msdn says subroutines inherit aL register if you're in a loop when
    //  you call, and further more _if you ever call this function in a loop,
    //  it must always be called in a loop_. So we'll just pass our loop
    //  variable as a function parameter in those cases.

    const int current_usage = (ctx->loops > 0) ? 1 : -1;
    RegisterList *reg = reglist_find(&ctx->used_registers, REG_TYPE_LABEL, regnum);

    if (reg == NULL)
        fail(ctx, "Invalid label for CALL");
    else if (reg->misc == 0)
        reg->misc = current_usage;
    else if (reg->misc != current_usage)
    {
        if (current_usage == 1)
            fail(ctx, "CALL to this label must be wrapped in LOOP/ENDLOOP");
        else
            fail(ctx, "CALL to this label must not be wrapped in LOOP/ENDLOOP");
    } // else if
}